

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsStyle.cxx
# Opt level: O3

void AddFeature(char *name,char *value,bool enable)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  size_type sVar4;
  kwsFeature f;
  value_type local_98;
  
  paVar1 = &local_98.name.field_2;
  local_98.name._M_string_length = 0;
  local_98.name.field_2._M_local_buf[0] = '\0';
  paVar2 = &local_98.value.field_2;
  local_98.value._M_string_length = 0;
  local_98.value.field_2._M_local_buf[0] = '\0';
  paVar3 = &local_98.filename.field_2;
  local_98.filename._M_string_length = 0;
  local_98.filename.field_2._M_local_buf[0] = '\0';
  local_98.name._M_dataplus._M_p = (pointer)paVar1;
  local_98.value._M_dataplus._M_p = (pointer)paVar2;
  local_98.filename._M_dataplus._M_p = (pointer)paVar3;
  strlen(name);
  std::__cxx11::string::_M_replace((ulong)&local_98,0,(char *)0x0,(ulong)name);
  sVar4 = local_98.value._M_string_length;
  strlen(value);
  std::__cxx11::string::_M_replace((ulong)&local_98.value,0,(char *)sVar4,(ulong)value);
  local_98.enable = true;
  std::__cxx11::string::_M_replace
            ((ulong)&local_98.filename,0,(char *)local_98.filename._M_string_length,0x169503);
  std::vector<kwsFeature,_std::allocator<kwsFeature>_>::push_back(&features,&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.filename._M_dataplus._M_p != paVar3) {
    operator_delete(local_98.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.value._M_dataplus._M_p != paVar2) {
    operator_delete(local_98.value._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_98.name._M_dataplus._M_p);
  }
  return;
}

Assistant:

static void AddFeature(const char* name,const char* value,bool enable)
{
  kwsFeature f;
  f.name = name;
  f.value = value;
  f.enable = enable;
  f.filename = "";
  features.push_back(f);
}